

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  MessageLite *pMVar4;
  undefined4 extraout_var;
  Nonnull<const_char_*> pcVar5;
  undefined1 *v1;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  undefined1 auStack_38 [16];
  
  v1 = auStack_38;
  pVar6 = Insert(this,number);
  pEVar3 = pVar6.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) goto LAB_001d4d67;
    pcVar5 = (Nonnull<const_char_*>)0x0;
LAB_001d4ce5:
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      if (0xed < (byte)(pEVar3->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 10
           ) {
          pcVar5 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar3->type * 4),10,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
        }
        if (pcVar5 == (Nonnull<const_char_*>)0x0) {
          bVar1 = pEVar3->field_0xa;
          pEVar3->field_0xa = bVar1 & 0xfd;
          pMVar4 = (MessageLite *)(pEVar3->field_0).int64_t_value;
          if ((bVar1 & 4) == 0) {
            return pMVar4;
          }
          iVar2 = (*pMVar4->_vptr_MessageLite[5])
                            (pMVar4,prototype,this->arena_,pMVar4->_vptr_MessageLite[5]);
          return (MessageLite *)CONCAT44(extraout_var,iVar2);
        }
        goto LAB_001d4dc9;
      }
      MutableMessage((ExtensionSet *)auStack_38);
LAB_001d4d87:
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)v1,10,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE"
                         );
      goto LAB_001d4ca9;
    }
    MutableMessage();
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      MutableMessage((ExtensionSet *)auStack_38);
LAB_001d4d67:
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_001d4ce5;
    }
    v1 = (undefined1 *)(ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (v1 != (undefined1 *)0xa) goto LAB_001d4d87;
    pcVar5 = (Nonnull<const_char_*>)0x0;
LAB_001d4ca9:
    if (pcVar5 == (Nonnull<const_char_*>)0x0) {
      pEVar3->is_repeated = false;
      pEVar3->field_0xa = (pEVar3->field_0xa & 0xfa) + 1;
      pMVar4 = MessageLite::New(prototype,this->arena_);
      (pEVar3->field_0).int64_t_value = (int64_t)pMVar4;
      pEVar3->field_0xa = pEVar3->field_0xa & 0xfd;
      return pMVar4;
    }
  }
  MutableMessage();
LAB_001d4dc9:
  MutableMessage();
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(prototype,
                                                              arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}